

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void G_SerializeLevel(FSerializer *arc,bool hubload)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  sector_t_conflict *obj;
  line_t_conflict *obj_00;
  side_t *obj_01;
  bool bVar7;
  uint uVar8;
  FSerializer *pFVar9;
  line_t_conflict *def;
  side_t *def_00;
  sector_t_conflict *def_01;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  int local_30;
  int local_2c;
  int i_2;
  int i_1;
  BYTE chk [16];
  int i;
  bool hubload_local;
  FSerializer *arc_local;
  
  chk._8_4_ = level.totaltime;
  chk[0xf] = hubload;
  bVar7 = FSerializer::isWriting(arc);
  if (bVar7) {
    FSerializer::Array<unsigned_char>(arc,"checksum",level.md5,0x10,false);
  }
  else {
    memset(&i_2,0,0x10);
    FSerializer::Array<unsigned_char>(arc,"checksum",(uchar *)&i_2,0x10,false);
    uVar8 = FSerializer::GetSize(arc,"linedefs");
    if ((((uVar8 == numlines) && (uVar8 = FSerializer::GetSize(arc,"sidedefs"), uVar8 == numsides))
        && (uVar8 = FSerializer::GetSize(arc,"sectors"), uVar8 == numsectors)) &&
       (uVar8 = FSerializer::GetSize(arc,"polyobjs"), uVar8 == po_NumPolyobjs)) {
      cVar10 = -(i_2._2_1_ == level.md5[2]);
      cVar11 = -(i_2._3_1_ == level.md5[3]);
      cVar12 = -((BYTE)i_1 == level.md5[4]);
      cVar13 = -(i_1._1_1_ == level.md5[5]);
      cVar14 = -(i_1._2_1_ == level.md5[6]);
      cVar15 = -(i_1._3_1_ == level.md5[7]);
      cVar16 = -(chk[0] == level.md5[8]);
      cVar17 = -(chk[1] == level.md5[9]);
      cVar18 = -(chk[2] == level.md5[10]);
      cVar19 = -(chk[3] == level.md5[0xb]);
      cVar20 = -(chk[4] == level.md5[0xc]);
      cVar21 = -(chk[5] == level.md5[0xd]);
      cVar22 = -(chk[6] == level.md5[0xe]);
      bVar23 = -(chk[7] == level.md5[0xf]);
      auVar1[1] = -(i_2._1_1_ == level.md5[1]);
      auVar1[0] = -((BYTE)i_2 == level.md5[0]);
      auVar1[2] = cVar10;
      auVar1[3] = cVar11;
      auVar1[4] = cVar12;
      auVar1[5] = cVar13;
      auVar1[6] = cVar14;
      auVar1[7] = cVar15;
      auVar1[8] = cVar16;
      auVar1[9] = cVar17;
      auVar1[10] = cVar18;
      auVar1[0xb] = cVar19;
      auVar1[0xc] = cVar20;
      auVar1[0xd] = cVar21;
      auVar1[0xe] = cVar22;
      auVar1[0xf] = bVar23;
      auVar2[1] = -(i_2._1_1_ == level.md5[1]);
      auVar2[0] = -((BYTE)i_2 == level.md5[0]);
      auVar2[2] = cVar10;
      auVar2[3] = cVar11;
      auVar2[4] = cVar12;
      auVar2[5] = cVar13;
      auVar2[6] = cVar14;
      auVar2[7] = cVar15;
      auVar2[8] = cVar16;
      auVar2[9] = cVar17;
      auVar2[10] = cVar18;
      auVar2[0xb] = cVar19;
      auVar2[0xc] = cVar20;
      auVar2[0xd] = cVar21;
      auVar2[0xe] = cVar22;
      auVar2[0xf] = bVar23;
      auVar6[1] = cVar11;
      auVar6[0] = cVar10;
      auVar6[2] = cVar12;
      auVar6[3] = cVar13;
      auVar6[4] = cVar14;
      auVar6[5] = cVar15;
      auVar6[6] = cVar16;
      auVar6[7] = cVar17;
      auVar6[8] = cVar18;
      auVar6[9] = cVar19;
      auVar6[10] = cVar20;
      auVar6[0xb] = cVar21;
      auVar6[0xc] = cVar22;
      auVar6[0xd] = bVar23;
      auVar5[1] = cVar12;
      auVar5[0] = cVar11;
      auVar5[2] = cVar13;
      auVar5[3] = cVar14;
      auVar5[4] = cVar15;
      auVar5[5] = cVar16;
      auVar5[6] = cVar17;
      auVar5[7] = cVar18;
      auVar5[8] = cVar19;
      auVar5[9] = cVar20;
      auVar5[10] = cVar21;
      auVar5[0xb] = cVar22;
      auVar5[0xc] = bVar23;
      auVar4[1] = cVar13;
      auVar4[0] = cVar12;
      auVar4[2] = cVar14;
      auVar4[3] = cVar15;
      auVar4[4] = cVar16;
      auVar4[5] = cVar17;
      auVar4[6] = cVar18;
      auVar4[7] = cVar19;
      auVar4[8] = cVar20;
      auVar4[9] = cVar21;
      auVar4[10] = cVar22;
      auVar4[0xb] = bVar23;
      auVar3[1] = cVar14;
      auVar3[0] = cVar13;
      auVar3[2] = cVar15;
      auVar3[3] = cVar16;
      auVar3[4] = cVar17;
      auVar3[5] = cVar18;
      auVar3[6] = cVar19;
      auVar3[7] = cVar20;
      auVar3[8] = cVar21;
      auVar3[9] = cVar22;
      auVar3[10] = bVar23;
      if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar23,CONCAT18(cVar22,CONCAT17(cVar21,CONCAT16(cVar20,
                                                  CONCAT15(cVar19,CONCAT14(cVar18,CONCAT13(cVar17,
                                                  CONCAT12(cVar16,CONCAT11(cVar15,cVar14))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar23,CONCAT17(cVar22,CONCAT16(cVar21,CONCAT15(cVar20,
                                                  CONCAT14(cVar19,CONCAT13(cVar18,CONCAT12(cVar17,
                                                  CONCAT11(cVar16,cVar15)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar23 >> 7) << 0xf) == 0xffff) goto LAB_005daf45;
    }
    I_Error("Savegame is from a different level");
  }
LAB_005daf45:
  FSerializer::operator()(arc,"saveversion",&SaveVersion);
  (*Renderer->_vptr_FRenderer[9])(Renderer,arc);
  bVar7 = FSerializer::isReading(arc);
  if (bVar7) {
    DThinker::DestroyAllThinkers();
    FInterpolator::ClearInterpolations(&interpolator);
    FSerializer::ReadObjects(arc,(bool)(chk[0xf] & 1));
  }
  pFVar9 = FSerializer::operator()(arc,"level.flags",&level.flags);
  pFVar9 = FSerializer::operator()(pFVar9,"level.flags2",&level.flags2);
  pFVar9 = FSerializer::operator()(pFVar9,"level.fadeto",&level.fadeto);
  pFVar9 = FSerializer::operator()(pFVar9,"level.found_secrets",&level.found_secrets);
  pFVar9 = FSerializer::operator()(pFVar9,"level.found_items",&level.found_items);
  pFVar9 = FSerializer::operator()(pFVar9,"level.killed_monsters",&level.killed_monsters);
  pFVar9 = FSerializer::operator()(pFVar9,"level.total_secrets",&level.total_secrets);
  pFVar9 = FSerializer::operator()(pFVar9,"level.total_items",&level.total_items);
  pFVar9 = FSerializer::operator()(pFVar9,"level.total_monsters",&level.total_monsters);
  pFVar9 = FSerializer::operator()(pFVar9,"level.gravity",&level.gravity);
  pFVar9 = FSerializer::operator()(pFVar9,"level.aircontrol",&level.aircontrol);
  pFVar9 = FSerializer::operator()(pFVar9,"level.teamdamage",&level.teamdamage);
  pFVar9 = FSerializer::operator()(pFVar9,"level.maptime",&level.maptime);
  pFVar9 = FSerializer::operator()(pFVar9,"level.totaltime",(int *)(chk + 8));
  pFVar9 = FSerializer::operator()(pFVar9,"level.skytexture1",&level.skytexture1);
  FSerializer::operator()(pFVar9,"level.skytexture2",&level.skytexture2);
  if ((chk[0xf] & 1) == 0) {
    level.totaltime._0_1_ = chk[8];
    level.totaltime._1_1_ = chk[9];
    level.totaltime._2_1_ = chk[10];
    level.totaltime._3_1_ = chk[0xb];
  }
  bVar7 = FSerializer::isReading(arc);
  if (bVar7) {
    sky1texture = level.skytexture1;
    sky2texture = level.skytexture2;
    R_InitSkyMap();
    G_AirControlChanged();
  }
  FBehavior::StaticSerializeModuleStates(arc);
  obj_00 = lines;
  def = TArray<line_t,_line_t>::operator[](&loadlines,0);
  FSerializer::Array<line_t>(arc,"linedefs",obj_00,def,numlines,false);
  obj_01 = sides;
  def_00 = TArray<side_t,_side_t>::operator[](&loadsides,0);
  FSerializer::Array<side_t>(arc,"sidedefs",obj_01,def_00,numsides,false);
  obj = sectors;
  def_01 = TArray<sector_t,_sector_t>::operator[](&loadsectors,0);
  FSerializer::Array<sector_t>(arc,"sectors",obj,def_01,numsectors,false);
  FSerializer::operator()(arc,"zones",&Zones);
  FSerializer::operator()(arc,"lineportals",&linePortals);
  FSerializer::operator()(arc,"sectorportals",&sectorPortals);
  bVar7 = FSerializer::isReading(arc);
  if (bVar7) {
    P_CollectLinkedPortals();
  }
  DThinker::SerializeThinkers(arc,(bool)((chk[0xf] ^ 0xff) & 1));
  FSerializer::Array<FPolyObj>(arc,"polyobjs",polyobjs,po_NumPolyobjs,false);
  FSerializer::operator()(arc,"subsectors",&subsectors);
  DBaseStatusBar::SerializeMessages(StatusBar,arc);
  AM_SerializeMarkers(arc);
  FRemapTable::StaticSerializeTranslations(arc);
  FCanvasTextureInfo::Serialize(arc);
  P_SerializePlayers(arc,(bool)(chk[0xf] & 1));
  P_SerializeSounds(arc);
  bVar7 = FSerializer::isReading(arc);
  if (bVar7) {
    for (local_2c = 0; local_2c < numsectors; local_2c = local_2c + 1) {
      P_Recalculate3DFloors(sectors + local_2c);
    }
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      if (((playeringame[local_30] & 1U) != 0) && ((&players)[(long)local_30 * 0x54] != 0)) {
        APlayerPawn::SetupWeaponSlots((APlayerPawn *)(&players)[(long)local_30 * 0x54]);
      }
    }
  }
  (*Renderer->_vptr_FRenderer[10])(Renderer,arc);
  return;
}

Assistant:

void G_SerializeLevel(FSerializer &arc, bool hubload)
{
	int i = level.totaltime;

	if (arc.isWriting())
	{
		arc.Array("checksum", level.md5, 16);
	}
	else
	{
		// prevent bad things from happening by doing a check on the size of level arrays and the map's entire checksum.
		// The old code happily tried to load savegames with any mismatch here, often causing meaningless errors
		// deep down in the deserializer or just a crash if the few insufficient safeguards were not triggered.
		BYTE chk[16] = { 0 };
		arc.Array("checksum", chk, 16);
		if (arc.GetSize("linedefs") != (unsigned)numlines ||
			arc.GetSize("sidedefs") != (unsigned)numsides ||
			arc.GetSize("sectors") != (unsigned)numsectors ||
			arc.GetSize("polyobjs") != (unsigned)po_NumPolyobjs ||
			memcmp(chk, level.md5, 16))
		{
			I_Error("Savegame is from a different level");
		}
	}
	arc("saveversion", SaveVersion);

	Renderer->StartSerialize(arc);
	if (arc.isReading())
	{
		DThinker::DestroyAllThinkers();
		interpolator.ClearInterpolations();
		arc.ReadObjects(hubload);
	}

	arc("level.flags", level.flags)
		("level.flags2", level.flags2)
		("level.fadeto", level.fadeto)
		("level.found_secrets", level.found_secrets)
		("level.found_items", level.found_items)
		("level.killed_monsters", level.killed_monsters)
		("level.total_secrets", level.total_secrets)
		("level.total_items", level.total_items)
		("level.total_monsters", level.total_monsters)
		("level.gravity", level.gravity)
		("level.aircontrol", level.aircontrol)
		("level.teamdamage", level.teamdamage)
		("level.maptime", level.maptime)
		("level.totaltime", i)
		("level.skytexture1", level.skytexture1)
		("level.skytexture2", level.skytexture2);

	// Hub transitions must keep the current total time
	if (!hubload)
		level.totaltime = i;

	if (arc.isReading())
	{
		sky1texture = level.skytexture1;
		sky2texture = level.skytexture2;
		R_InitSkyMap();
		G_AirControlChanged();
	}



	// fixme: This needs to ensure it reads from the correct place. Should be one once there's enough of this code converted to JSON

	FBehavior::StaticSerializeModuleStates(arc);
	// The order here is important: First world state, then portal state, then thinkers, and last polyobjects.
	arc.Array("linedefs", lines, &loadlines[0], numlines);
	arc.Array("sidedefs", sides, &loadsides[0], numsides);
	arc.Array("sectors", sectors, &loadsectors[0], numsectors);
	arc("zones", Zones);
	arc("lineportals", linePortals);
	arc("sectorportals", sectorPortals);
	if (arc.isReading()) P_CollectLinkedPortals();

	DThinker::SerializeThinkers(arc, !hubload);
	arc.Array("polyobjs", polyobjs, po_NumPolyobjs);
	arc("subsectors", subsectors);
	StatusBar->SerializeMessages(arc);
	AM_SerializeMarkers(arc);
	FRemapTable::StaticSerializeTranslations(arc);
	FCanvasTextureInfo::Serialize(arc);
	P_SerializePlayers(arc, hubload);
	P_SerializeSounds(arc);

	if (arc.isReading())
	{
		for (int i = 0; i < numsectors; i++)
		{
			P_Recalculate3DFloors(&sectors[i]);
		}
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i] && players[i].mo != NULL)
			{
				players[i].mo->SetupWeaponSlots();
			}
		}
	}
	Renderer->EndSerialize(arc);

}